

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtimezoneprivate.cpp
# Opt level: O2

bool isEntryInIanaList(QByteArrayView id,QByteArrayView ianaIds)

{
  long lVar1;
  bool bVar2;
  qsizetype qVar3;
  long in_FS_OFFSET;
  QByteArrayView local_60;
  QByteArrayView local_50;
  QByteArrayView id_local;
  
  id_local.m_data = id.m_data;
  id_local.m_size = id.m_size;
  local_50.m_data = ianaIds.m_data;
  local_50.m_size = ianaIds.m_size;
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  do {
    qVar3 = QByteArrayView::indexOf(&local_50,' ',0);
    if (qVar3 < 0) {
      bVar2 = comparesEqual(&id_local,&local_50);
LAB_003acd68:
      if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
        return bVar2;
      }
      __stack_chk_fail();
    }
    local_60.m_data = local_50.m_data;
    local_60.m_size = qVar3;
    bVar2 = comparesEqual(&id_local,&local_60);
    if (bVar2) {
      bVar2 = true;
      goto LAB_003acd68;
    }
    local_50.m_data = local_50.m_data + qVar3 + 1;
    local_50.m_size = local_50.m_size - (qVar3 + 1);
  } while( true );
}

Assistant:

static bool isEntryInIanaList(QByteArrayView id, QByteArrayView ianaIds)
{
    qsizetype cut;
    while ((cut = ianaIds.indexOf(' ')) >= 0) {
        if (id == ianaIds.first(cut))
            return true;
        ianaIds = ianaIds.sliced(cut + 1);
    }
    return id == ianaIds;
}